

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::lts_20240722::Mutex::InternalAttemptToUseMutexInFatalSignalHandler(void)

{
  long lVar1;
  ThreadIdentity *identity;
  
  lVar1 = absl::lts_20240722::base_internal::CurrentThreadIdentityIfPresent();
  if (lVar1 != 0) {
    *(undefined1 *)(lVar1 + 0x14) = 1;
  }
  std::atomic<absl::lts_20240722::OnDeadlockCycle>::store
            ((atomic<absl::lts_20240722::OnDeadlockCycle> *)
             &(anonymous_namespace)::synch_deadlock_detection,kIgnore,memory_order_release);
  return;
}

Assistant:

void Mutex::InternalAttemptToUseMutexInFatalSignalHandler() {
  // Fix the per-thread state only if it exists.
  ThreadIdentity* identity = CurrentThreadIdentityIfPresent();
  if (identity != nullptr) {
    identity->per_thread_synch.suppress_fatal_errors = true;
  }
  // Don't do deadlock detection when we are already failing.
  synch_deadlock_detection.store(OnDeadlockCycle::kIgnore,
                                 std::memory_order_release);
}